

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
::MarkExprResultVars
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
           *this,BasicFlatConverter *cvt)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  if ((this->super_BasicConstraintKeeper).acc_level_expr_ < 0) {
    uVar1 = (this->super_BasicConstraintKeeper).acc_level_item_;
    uVar3 = 0;
    if (uVar1 != 0xfffffffe) {
      uVar3 = uVar1;
    }
    if ((int)uVar3 < 0) {
      uVar3 = (this->super_BasicConstraintKeeper).acc_level_default_;
      iVar2 = (*(this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper[0x13])(this);
      if (-1 < iVar2) {
        uVar3 = (*(this->super_BasicConstraintKeeper)._vptr_BasicConstraintKeeper[0x13])(this);
      }
    }
    if (4 < uVar3) {
      std::__throw_out_of_range_fmt
                ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)uVar3,5);
    }
    (this->super_BasicConstraintKeeper).acc_level_expr_ =
         *(int *)(&DAT_004a0534 + (long)(int)uVar3 * 4);
  }
  return;
}

Assistant:

void DoMarkForResultVars() {
    const auto eal        // as expr only
        = GetChosenAcceptanceLevelEXPR();
    if (ExpressionAcceptanceLevel::NotAccepted!=eal) {    // accepted
      for (int i=0; i< (int)cons_.size(); ++i) {
        const auto& cnt = cons_[i];
        if (!cnt.IsRedundant()) {
          const auto& con = cnt.GetCon();
          // Delegate actual logic to Converter
          GetConverter().ConsiderMarkingResultVar(con, i, eal);
        }
      }
    }
  }